

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

ON__UINT32 __thiscall
ON_OutlineFigure::Internal_FigureEndDex(ON_OutlineFigure *this,bool bLogErrors)

{
  bool bVar1;
  uint uVar2;
  ON_OutlineFigurePoint *pOVar3;
  ON__UINT32 count;
  bool bLogErrors_local;
  ON_OutlineFigure *this_local;
  
  uVar2 = ON_SimpleArray<ON_OutlineFigurePoint>::UnsignedCount(&this->m_points);
  if (1 < uVar2) {
    pOVar3 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[](&this->m_points,0);
    bVar1 = ON_OutlineFigurePoint::IsBeginFigurePoint(pOVar3);
    if (bVar1) {
      pOVar3 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[](&this->m_points,uVar2 - 1);
      bVar1 = ON_OutlineFigurePoint::IsEndFigurePoint(pOVar3);
      if (bVar1) {
        return uVar2 - 1;
      }
    }
  }
  if (bLogErrors) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
               ,0x691,"","Figure is missing start or end point.");
  }
  return 0;
}

Assistant:

ON__UINT32 ON_OutlineFigure::Internal_FigureEndDex(
  bool bLogErrors
  ) const
{
  const ON__UINT32 count = m_points.UnsignedCount();
  if (
    count >= 2
    && m_points[0].IsBeginFigurePoint()
    && m_points[count - 1].IsEndFigurePoint()
    )
  {
    return (count - 1);
  }

  if (bLogErrors)
  {
    ON_ERROR("Figure is missing start or end point.");    
  }
  return 0;
}